

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

bool google::protobuf::CaseEqual(StringPiece s1,StringPiece s2)

{
  int iVar1;
  stringpiece_ssize_type sVar2;
  stringpiece_ssize_type sVar3;
  char *s1_00;
  char *s2_00;
  size_t len;
  undefined1 local_30 [8];
  StringPiece s2_local;
  StringPiece s1_local;
  
  s2_local.length_ = (stringpiece_ssize_type)s1.ptr_;
  s2_local.ptr_ = (char *)s2.length_;
  local_30 = (undefined1  [8])s2.ptr_;
  sVar2 = StringPiece::size((StringPiece *)&s2_local.length_);
  sVar3 = StringPiece::size((StringPiece *)local_30);
  if (sVar2 == sVar3) {
    s1_00 = StringPiece::data((StringPiece *)&s2_local.length_);
    s2_00 = StringPiece::data((StringPiece *)local_30);
    len = StringPiece::size((StringPiece *)&s2_local.length_);
    iVar1 = memcasecmp(s1_00,s2_00,len);
    s1_local.length_._7_1_ = iVar1 == 0;
  }
  else {
    s1_local.length_._7_1_ = false;
  }
  return s1_local.length_._7_1_;
}

Assistant:

inline bool CaseEqual(StringPiece s1, StringPiece s2) {
  if (s1.size() != s2.size()) return false;
  return memcasecmp(s1.data(), s2.data(), s1.size()) == 0;
}